

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

bool MeCab::Viterbi::buildBestLattice(Lattice *lattice)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  
  iVar2 = (*lattice->_vptr_Lattice[3])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  while (plVar1 = (long *)*plVar3, plVar1 != (long *)0x0) {
    *(undefined1 *)(plVar3 + 10) = 1;
    plVar1[1] = (long)plVar3;
    plVar3 = plVar1;
  }
  return true;
}

Assistant:

bool Viterbi::buildBestLattice(Lattice *lattice) {
  Node *node = lattice->eos_node();
  for (Node *prev_node; node->prev;) {
    node->isbest = 1;
    prev_node = node->prev;
    prev_node->next = node;
    node = prev_node;
  }

  return true;
}